

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O3

void anon_unknown.dwarf_1ee9f1::fillPixels<half>(Array2D<half> *ph,int width,int height)

{
  long lVar1;
  unsigned_short uVar2;
  long lVar3;
  half *phVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  float i;
  uint local_4c;
  
  lVar3 = (long)height * (long)width;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar5 = lVar3 * 2;
  }
  phVar4 = (half *)operator_new__(uVar5);
  if (ph->_data != (half *)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = (long)width;
  ph->_data = phVar4;
  if (0 < height) {
    lVar3 = 0;
    local_4c = 0;
    uVar5 = 0;
    do {
      if (0 < width) {
        uVar6 = 0;
        uVar7 = local_4c;
        do {
          i = (float)(uVar7 % 0x801);
          lVar1 = ph->_sizeY;
          phVar4 = ph->_data;
          if (uVar7 % 0x801 == 0) {
            uVar2 = (unsigned_short)((uint)i >> 0x10);
          }
          else if (half::_eLut[(uint)i >> 0x17] == 0) {
            uVar2 = half::convert((int)i);
          }
          else {
            uVar2 = half::_eLut[(uint)i >> 0x17] +
                    (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd)
            ;
          }
          *(unsigned_short *)((long)&phVar4[uVar6]._h + lVar1 * lVar3) = uVar2;
          uVar6 = uVar6 + 1;
          uVar7 = uVar7 + 1;
        } while ((uint)width != uVar6);
      }
      uVar5 = uVar5 + 1;
      local_4c = local_4c + width;
      lVar3 = lVar3 + 2;
    } while (uVar5 != (uint)height);
  }
  return;
}

Assistant:

void fillPixels (Array2D<T> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}